

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::removeFreeColumnSingleton(HPresolve *this,int col,int row,int k)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  int *piVar1;
  vector<int,_std::allocator<int>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ostream *poVar6;
  reference pvVar7;
  size_type __n;
  reference pvVar8;
  size_type __n_00;
  size_type __n_01;
  double dVar9;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> newCosts;
  pair<int,_double> local_40;
  
  dVar9 = HTimerPre::getWallTime(&this->timer);
  (this->timer).itemStart[7] = dVar9;
  if (0 < this->iPrint) {
    poVar6 = std::operator<<((ostream *)&std::cout,"PR: Free column singleton ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,col);
    poVar6 = std::operator<<(poVar6," removed. Row ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,row);
    poVar6 = std::operator<<(poVar6," removed.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  newCosts.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newCosts.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newCosts.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_02 = &(this->super_HPreData).ARstart;
  pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_02,(long)row);
  __n_00 = (size_type)*pvVar7;
  this_03 = &(this->super_HPreData).flagCol;
  this_00 = &(this->super_HPreData).colCost;
  __n = (size_type)col;
  this_01 = &(this->super_HPreData).Avalue;
  while( true ) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_02,(long)(row + 1));
    if ((long)*pvVar7 <= (long)__n_00) break;
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).ARindex,__n_00);
    iVar5 = *pvVar7;
    __n_01 = (size_type)iVar5;
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_03,__n_01);
    if ((iVar5 != col) && (*pvVar7 != 0)) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_00,__n_01);
      local_40.second = *pvVar8;
      local_40.first = iVar5;
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<std::pair<int,double>>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&newCosts,
                 &local_40);
      pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_00,__n_01);
      dVar9 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
      dVar2 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).ARvalue,__n_00);
      dVar3 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_01,(long)k);
      dVar4 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_00,__n_01);
      *pvVar8 = dVar9 - (dVar2 * dVar3) / dVar4;
    }
    __n_00 = __n_00 + 1;
  }
  if (this->iKKTcheck == 1) {
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::push_back(&(this->super_HPreData).chk.costs.c,&newCosts);
  }
  pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_03,__n);
  *pvVar7 = 0;
  pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
  std::deque<double,_std::allocator<double>_>::push_back(&(this->super_HPreData).postValue.c,pvVar8)
  ;
  fillStackRowBounds(this,row);
  pvVar8 = std::vector<double,_std::allocator<double>_>::at
                     (&(this->super_HPreData).valueColDual,__n);
  *pvVar8 = 0.0;
  pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
  dVar9 = *pvVar8;
  pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_01,(long)k);
  dVar2 = *pvVar8;
  pvVar8 = std::vector<double,_std::allocator<double>_>::at
                     (&(this->super_HPreData).valueRowDual,(long)row);
  *pvVar8 = -dVar9 / dVar2;
  addChange(this,7,row,col);
  removeRow(this,row);
  piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 7;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 7;
  *piVar1 = *piVar1 + 1;
  HTimerPre::recordFinish(&this->timer,7);
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&newCosts.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  return;
}

Assistant:

void HPresolve::removeFreeColumnSingleton(const int col, const int row, const int k) {
	timer.recordStart(FREE_SING_COL);
	if (iPrint > 0)
		cout << "PR: Free column singleton " << col << " removed. Row " << row
				<< " removed." << endl;

	//modify costs
	vector<pair<int, double> > newCosts;
	int j;
	for (int kk = ARstart.at(row); kk < ARstart.at(row + 1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j != col) {
			newCosts.push_back(make_pair(j, colCost.at(j)));
			colCost.at(j) = colCost.at(j)
					- colCost.at(col) * ARvalue.at(kk) / Avalue.at(k);
		}
	}
	if (iKKTcheck == 1)
		chk.costs.push(newCosts);

	flagCol.at(col) = 0;
	postValue.push(colCost.at(col));
	fillStackRowBounds (row);

	valueColDual.at(col) = 0;
	valueRowDual.at(row) = -colCost.at(col) / Avalue.at(k);

	addChange(FREE_SING_COL, row, col);
	removeRow(row);

	countRemovedCols[FREE_SING_COL]++;
	countRemovedRows[FREE_SING_COL]++;
	timer.recordFinish(FREE_SING_COL);
}